

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O3

int32 make_ci_list_cd_hash_frm_phnlist
                (char *phnlist,char ***CIlist,int32 *cilistsize,hashelement_t ***CDhash,
                int32 *NCDphones)

{
  uint uVar1;
  uint uVar2;
  hashelement_t ***ppphVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  phnhashelement_t **hashtable;
  lineiter_t *li;
  size_t sVar7;
  hashelement_t *phVar8;
  heapelement_t *phVar9;
  char *pcVar10;
  char **ppcVar11;
  char *fmt;
  phnhashelement_t *ppVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int32 heapsize;
  heapelement_t **heap;
  char wdpos [1024];
  char rctx [1024];
  char lctx [1024];
  char bphn [1024];
  uint local_1094;
  uint local_1090;
  uint local_108c;
  uint local_1088;
  uint local_1084;
  char *local_1080;
  phnhashelement_t **local_1078;
  hashelement_t **local_1070;
  heapelement_t **local_1068;
  FILE *local_1060;
  char ***local_1058;
  hashelement_t ***local_1050;
  int *local_1048;
  uint *local_1040;
  short local_1038 [512];
  int local_c38 [256];
  int local_838 [256];
  short local_438 [516];
  
  local_1068 = (heapelement_t **)0x0;
  local_1080 = phnlist;
  local_1040 = (uint *)cilistsize;
  __stream = fopen(phnlist,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x74,"Unable to open %s for reading\n",local_1080);
LAB_00103811:
    exit(1);
  }
  local_1058 = CIlist;
  hashtable = (phnhashelement_t **)calloc(0x65,8);
  local_1070 = (hashelement_t **)
               __ckd_calloc__(0x5dc1,8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                              ,0x78);
  local_1078 = hashtable;
  phninstall("SIL",hashtable);
  li = lineiter_start_clean((FILE *)__stream);
  uVar6 = 0;
  local_1050 = CDhash;
  local_1048 = NCDphones;
  if (li == (lineiter_t *)0x0) {
    local_1080 = (char *)0x1;
    local_1090 = 0;
    local_1088 = 0;
    local_1084 = 0;
    local_108c = 0;
  }
  else {
    local_108c = 0;
    iVar14 = 0;
    local_1084 = 0;
    local_1088 = 0;
    local_1090 = 0;
    local_1060 = __stream;
    do {
      iVar5 = __isoc99_sscanf(li->buf,"%s %s %s %s",local_438,local_838,local_c38,local_1038);
      if ((1 < iVar5 - 3U) && (iVar5 != 1)) {
        pcVar10 = li->buf;
        fmt = "Incorrect format in triphone file %s\n%s\n";
        lVar16 = 0x83;
LAB_00103800:
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                ,lVar16,fmt,local_1080,pcVar10);
        goto LAB_00103811;
      }
      if (local_438[0] == 0x2d) {
        pcVar10 = li->buf;
        fmt = "Bad entry triphone file %s\n%s\n";
        lVar16 = 0x85;
        goto LAB_00103800;
      }
      if ((iVar5 == 1) || ((ushort)local_c38[0] == 0x2d && (short)local_838[0] == 0x2d)) {
        sVar7 = strlen((char *)local_438);
        iVar5 = (int)sVar7;
        if ((int)sVar7 < iVar14) {
          iVar5 = iVar14;
        }
        iVar14 = iVar5;
        phninstall((char *)local_438,local_1078);
      }
      else {
        if (iVar5 == 3) {
          local_1038[0] = 0x69;
        }
        if (((((char)local_838[0] == '+') || (local_838[0] == 0x4c4953)) ||
            (((ushort)local_c38[0] & 0xff) == 0x2b)) || (local_c38[0] == 0x4c4953)) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x93,"Fillers in triphone, skipping:\n%s\n",li->buf);
        }
        else {
          phVar8 = install((char *)local_438,(char *)local_838,(char *)local_c38,(char *)local_1038,
                           local_1070);
          if (phVar8->dictcount == 0) {
            if (local_1038[0] == 0x62) {
              local_1090 = local_1090 + 1;
            }
            else if (local_1038[0] == 0x65) {
              local_1088 = local_1088 + 1;
            }
            else if (local_1038[0] == 0x73) {
              local_108c = local_108c + 1;
            }
            else {
              local_1084 = local_1084 + (local_1038[0] == 0x69);
            }
            phVar8->dictcount = 1;
          }
        }
      }
      li = lineiter_next(li);
    } while (li != (lineiter_t *)0x0);
    local_1080 = (char *)(ulong)(iVar14 + 1);
    __stream = local_1060;
  }
  fclose(__stream);
  local_1094 = 0;
  lVar16 = 0;
  do {
    for (ppVar12 = local_1078[lVar16]; ppVar12 != (phnhashelement_t *)0x0; ppVar12 = ppVar12->next)
    {
      phVar9 = (heapelement_t *)
               __ckd_calloc__(1,0x28,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                              ,0xad);
      pcVar10 = strdup(ppVar12->phone);
      phVar9->basephone = pcVar10;
      uVar6 = insert(&local_1068,uVar6,phVar9);
      local_1094 = uVar6;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x65);
  freephnhash(local_1078);
  *local_1040 = uVar6;
  ppcVar11 = (char **)__ckd_calloc_2d__((long)(int)uVar6,(size_t)local_1080,1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                        ,0xb5);
  *local_1058 = ppcVar11;
  uVar15 = uVar6;
  if (0 < (int)uVar6) {
    uVar13 = 0;
    do {
      phVar9 = yanktop(&local_1068,local_1094,(int32 *)&local_1094);
      strcpy(ppcVar11[uVar13],phVar9->basephone);
      free_heapelement(phVar9);
      uVar13 = uVar13 + 1;
      uVar15 = local_1094;
    } while (uVar6 != uVar13);
  }
  piVar4 = local_1048;
  ppphVar3 = local_1050;
  uVar6 = local_108c;
  if (uVar15 != 0) {
    __assert_fail("heapsize == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0xbb,
                  "int32 make_ci_list_cd_hash_frm_phnlist(const char *, char ***, int32 *, hashelement_t ***, int32 *)"
                 );
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0xbd,"%d single word triphones in input phone list\n",(ulong)local_108c);
  uVar15 = local_1090;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0xbe,"%d word beginning triphones in input phone list\n",(ulong)local_1090);
  uVar2 = local_1084;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0xbf,"%d word internal triphones in input phone list\n",(ulong)local_1084);
  uVar1 = local_1088;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0xc0,"%d word ending triphones in input phone list\n",(ulong)local_1088);
  *ppphVar3 = local_1070;
  *piVar4 = uVar2 + uVar6 + uVar1 + uVar15;
  return 0;
}

Assistant:

int32 make_ci_list_cd_hash_frm_phnlist(const char  *phnlist,
		           	    char  ***CIlist, 
                           	    int32 *cilistsize,
			   	    hashelement_t ***CDhash,
				    int32 *NCDphones)
{
    char  bphn[1024],lctx[1024], rctx[1024], wdpos[1024]; 
    char  **cilist, *silence="SIL";
    lineiter_t *line = NULL;
    heapelement_t **heap=NULL, *addciphone;
    hashelement_t **tphnhash, *tphnptr;
    phnhashelement_t  **phnhash, *phnptr;

    int32 swdtphs, bwdtphs, ewdtphs, iwdtphs, maxphnsize, phnsize;
    int32 heapsize, i, nciphns, nwds;
    FILE  *fp;

    fp = fopen(phnlist,"r");
    if (fp==NULL) E_FATAL("Unable to open %s for reading\n",phnlist);

   /* Initially hash everything to remove duplications */
    phnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t*));
    tphnhash = (hashelement_t**) ckd_calloc(HASHSIZE, sizeof(hashelement_t*));
    maxphnsize = 0;
    swdtphs = bwdtphs = ewdtphs = iwdtphs = 0;
    /* Always install SIL in phonelist */
    phninstall(silence,phnhash);

    for (line = lineiter_start_clean(fp); line; line = lineiter_next(line)) {

        nwds = sscanf(line->buf,"%s %s %s %s",bphn,lctx,rctx,wdpos);

        if (nwds != 1 && nwds != 3 &&  nwds != 4)
	    E_FATAL("Incorrect format in triphone file %s\n%s\n",phnlist,line->buf);
        if (strcmp(bphn,"-") == 0)
	    E_FATAL("Bad entry triphone file %s\n%s\n",phnlist,line->buf);
	    
        if (nwds == 1 || (!strcmp(lctx,"-") && !strcmp(rctx,"-"))) {
	    phnsize = strlen(bphn);
 	    if (phnsize > maxphnsize) maxphnsize = phnsize;
	    phninstall(bphn,phnhash);
        }
        else {
            if (nwds == 3) strcpy(wdpos,"i"); /* default */
            if (!strcmp(lctx,"-") && !strcmp(rctx,"-") && !strcmp(wdpos,"-")){
	        E_WARN("Bad entry triphone file %s\n%s\n",phnlist,line->buf);
		continue;
	    }
	    if (IS_FILLER(lctx) || IS_FILLER(rctx)){
		E_WARN("Fillers in triphone, skipping:\n%s\n",line->buf);
		continue;
	    }
            if (!strcmp(wdpos,"i") && !strcmp(wdpos,"b") && 
		!strcmp(wdpos,"e") && !strcmp(wdpos,"s")){
		E_WARN("Bad word position type %s in triphone list\n",wdpos);
		E_WARN("Mapping it to word internal triphone\n");
		strcpy(wdpos,"i");
	    }
            tphnptr = install(bphn,lctx,rctx,wdpos,tphnhash);
	    if (tphnptr->dictcount == 0){
	        if (strcmp(wdpos,"s")==0) swdtphs++;
	        else if (strcmp(wdpos,"b")==0) bwdtphs++;
	        else if (strcmp(wdpos,"e")==0) ewdtphs++;
	        else if (strcmp(wdpos,"i")==0) iwdtphs++;
	        tphnptr->dictcount++;
	    }
	}
    }
    fclose(fp);

    /* Heap sort CI phones */
    heapsize = 0;
    for (i = 0; i < PHNHASHSIZE; i++) {
        phnptr = phnhash[i];
        while (phnptr != NULL) {
            addciphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
            addciphone->basephone = strdup(phnptr->phone);
            heapsize = insert(&heap, heapsize, addciphone);
            phnptr = phnptr->next;
        }
    }
    freephnhash(phnhash);
    *cilistsize = nciphns = heapsize;
    *CIlist = cilist = (char**)ckd_calloc_2d(nciphns,maxphnsize+1,sizeof(char));
    for (i = 0; i < nciphns; i++){
	addciphone = yanktop(&heap,heapsize,&heapsize);
        strcpy(cilist[i],addciphone->basephone);
        free_heapelement(addciphone);
    }
    assert(heapsize == 0);

    E_INFO("%d single word triphones in input phone list\n",swdtphs);
    E_INFO("%d word beginning triphones in input phone list\n",bwdtphs);
    E_INFO("%d word internal triphones in input phone list\n",iwdtphs);
    E_INFO("%d word ending triphones in input phone list\n",ewdtphs);

    *CDhash = tphnhash;
    *NCDphones = swdtphs + bwdtphs + iwdtphs + ewdtphs;

    return S3_SUCCESS;
}